

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_read_attributes_double(void *a,double **attrib)

{
  ssize_t sVar1;
  uint8_t *compressed;
  int iVar2;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_attrib;
  uint32_t nr_of_doubles;
  
  iVar2 = 0;
  if (*(int *)((long)a + 0x24) == 0x10) {
    sVar1 = read((int)&nr_attrib,(void *)0x4,1);
    if ((int)sVar1 == 0) {
      iVar2 = 0;
    }
    else {
      sVar1 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
      iVar2 = 0;
      if ((int)sVar1 != 0) {
        compressed = (uint8_t *)malloc((ulong)nr_of_compressed_bytes);
        sVar1 = read((int)compressed,(void *)0x1,(ulong)nr_of_compressed_bytes);
        iVar2 = 0;
        if ((int)sVar1 != 0) {
          if (attrib != (double **)0x0) {
            trico_decompress_double_precision(&nr_of_doubles,attrib,compressed);
            if (nr_of_doubles != nr_attrib) {
              __assert_fail("nr_of_doubles == nr_attrib",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                            ,0x581,"int trico_read_attributes_double(void *, double **)");
            }
          }
          free(compressed);
          read_next_stream_type((trico_archive *)a);
          iVar2 = 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int trico_read_attributes_double(void* a, double** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_attribute_double_stream)
    return 0;

  uint32_t nr_attrib;
  if (!read(&nr_attrib, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint32_t nr_of_doubles;

  if (attrib != NULL)
    {
    trico_decompress_double_precision(&nr_of_doubles, attrib, (const uint8_t*)compressed);
    assert(nr_of_doubles == nr_attrib);
    }

  trico_free(compressed);
  

  read_next_stream_type(arch);

  return 1;
  }